

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directory.cpp
# Opt level: O0

BOOL CreateDirectoryA(LPCSTR lpPathName,LPSECURITY_ATTRIBUTES lpSecurityAttributes)

{
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  LPSTR pCVar4;
  DWORD dwErrCode;
  int iVar5;
  size_t sVar6;
  int *piVar7;
  char *string;
  size_t sizeInBytes;
  long in_FS_OFFSET;
  undefined8 uStack_70;
  char acStack_68 [12];
  BOOL local_5c;
  int local_58;
  int local_54;
  char *pcStack_50;
  int iLen;
  char *cwd;
  int local_40;
  int mode;
  int i;
  int pathLength;
  LPSTR UnixPathName;
  char *realPath;
  DWORD dwLastError;
  BOOL bRet;
  LPSECURITY_ATTRIBUTES lpSecurityAttributes_local;
  LPCSTR lpPathName_local;
  
  string = acStack_68;
  lpPathName_local = *(LPCSTR *)(in_FS_OFFSET + 0x28);
  realPath._4_4_ = 0;
  realPath._0_4_ = 0;
  _i = (char *)0x0;
  cwd._4_4_ = 0x1ff;
  _dwLastError = lpSecurityAttributes;
  lpSecurityAttributes_local = (LPSECURITY_ATTRIBUTES)lpPathName;
  if (!PAL_InitializeChakraCoreCalled) {
    uStack_70 = 0x17e8db;
    abort();
  }
  if (lpSecurityAttributes == (LPSECURITY_ATTRIBUTES)0x0) {
    if (lpPathName == (LPCSTR)0x0) {
      if (!PAL_InitializeChakraCoreCalled) {
        uStack_70 = 0x17e968;
        abort();
      }
      realPath._0_4_ = 3;
      string = acStack_68;
    }
    else {
      uStack_70 = 0x17e97d;
      _i = PAL__strdup(lpPathName);
      if (_i == (char *)0x0) {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          uStack_70 = 0x17e999;
          abort();
        }
        realPath._0_4_ = 8;
        string = acStack_68;
      }
      else {
        uStack_70 = 0x17e9ae;
        FILEDosToUnixPathA(_i);
        uStack_70 = 0x17e9b7;
        sVar6 = strlen(_i);
        mode = (int)sVar6;
        local_40 = mode;
        while ((1 < local_40 && (_i[local_40 + -1] == '/'))) {
          _i[local_40 + -1] = '\0';
          local_40 = local_40 + -1;
        }
        if (*_i == '/') {
          UnixPathName = _i;
          string = acStack_68;
        }
        else {
          uStack_70 = 0x17ea23;
          pcStack_50 = PAL__getcwd((char *)0x0,0x400);
          if (pcStack_50 == (char *)0x0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              uStack_70 = 0x17ea40;
              abort();
            }
            uStack_70 = 0x17ea45;
            piVar7 = __errno_location();
            uStack_70 = 0x17ea4c;
            strerror(*piVar7);
            uStack_70 = 0x17ea51;
            realPath._0_4_ = DIRGetLastErrorFromErrno();
            goto LAB_0017eb72;
          }
          uStack_70 = 0x17ea62;
          sVar6 = strlen(pcStack_50);
          pcVar3 = _i;
          pcVar2 = pcStack_50;
          local_54 = (int)sVar6 + 2 + mode;
          lVar1 = -((long)local_54 + 0xfU & 0xfffffffffffffff0);
          string = acStack_68 + lVar1;
          sizeInBytes = (size_t)local_54;
          UnixPathName = string;
          *(undefined8 *)((long)&uStack_70 + lVar1) = 0x17eaa9;
          sprintf_s(string,sizeInBytes,"%s/%s",pcVar2,pcVar3);
          pcVar2 = pcStack_50;
          *(undefined8 *)((long)&uStack_70 + lVar1) = 0x17eab2;
          PAL_free(pcVar2);
        }
        pCVar4 = UnixPathName;
        string[-8] = -0x45;
        string[-7] = -0x16;
        string[-6] = '\x17';
        string[-5] = '\0';
        string[-4] = '\0';
        string[-3] = '\0';
        string[-2] = '\0';
        string[-1] = '\0';
        FILECanonicalizePath(pCVar4);
        pCVar4 = UnixPathName;
        string[-8] = -0x3c;
        string[-7] = -0x16;
        string[-6] = '\x17';
        string[-5] = '\0';
        string[-4] = '\0';
        string[-3] = '\0';
        string[-2] = '\0';
        string[-1] = '\0';
        sVar6 = strlen(pCVar4);
        pCVar4 = UnixPathName;
        if (sVar6 < 0x400) {
          string[-8] = -9;
          string[-7] = -0x16;
          string[-6] = '\x17';
          string[-5] = '\0';
          string[-4] = '\0';
          string[-3] = '\0';
          string[-2] = '\0';
          string[-1] = '\0';
          iVar5 = mkdir(pCVar4,0x1ff);
          if (iVar5 == 0) {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              string[-8] = 'i';
              string[-7] = -0x15;
              string[-6] = '\x17';
              string[-5] = '\0';
              string[-4] = '\0';
              string[-3] = '\0';
              string[-2] = '\0';
              string[-1] = '\0';
              abort();
            }
            realPath._4_4_ = 1;
          }
          else {
            if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
              string[-8] = '\r';
              string[-7] = -0x15;
              string[-6] = '\x17';
              string[-5] = '\0';
              string[-4] = '\0';
              string[-3] = '\0';
              string[-2] = '\0';
              string[-1] = '\0';
              abort();
            }
            string[-8] = '\x12';
            string[-7] = -0x15;
            string[-6] = '\x17';
            string[-5] = '\0';
            string[-4] = '\0';
            string[-3] = '\0';
            string[-2] = '\0';
            string[-1] = '\0';
            __errno_location();
            string[-8] = '\x17';
            string[-7] = -0x15;
            string[-6] = '\x17';
            string[-5] = '\0';
            string[-4] = '\0';
            string[-3] = '\0';
            string[-2] = '\0';
            string[-1] = '\0';
            piVar7 = __errno_location();
            pCVar4 = UnixPathName;
            local_58 = *piVar7;
            if (local_58 != 2) {
              if (local_58 == 0x11) {
                realPath._0_4_ = 0xb7;
                goto LAB_0017eb72;
              }
              if (local_58 != 0x14) {
                realPath._0_4_ = 5;
                goto LAB_0017eb72;
              }
            }
            string[-8] = 'D';
            string[-7] = -0x15;
            string[-6] = '\x17';
            string[-5] = '\0';
            string[-4] = '\0';
            string[-3] = '\0';
            string[-2] = '\0';
            string[-1] = '\0';
            FILEGetProperNotFoundError(pCVar4,(LPDWORD)&realPath);
          }
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            string[-8] = -0x23;
            string[-7] = -0x16;
            string[-6] = '\x17';
            string[-5] = '\0';
            string[-4] = '\0';
            string[-3] = '\0';
            string[-2] = '\0';
            string[-1] = '\0';
            abort();
          }
          realPath._0_4_ = 0xce;
        }
      }
    }
  }
  else {
    uStack_70 = 0x17e92c;
    fprintf(_stderr,"] %s %s:%d","CreateDirectoryA",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/file/directory.cpp"
            ,0x21e);
    uStack_70 = 0x17e944;
    fprintf(_stderr,"lpSecurityAttributes is not NULL as it should be\n");
    realPath._0_4_ = 0x57;
    string = acStack_68;
  }
LAB_0017eb72:
  dwErrCode = (DWORD)realPath;
  if ((DWORD)realPath != 0) {
    string[-8] = -0x80;
    string[-7] = -0x15;
    string[-6] = '\x17';
    string[-5] = '\0';
    string[-4] = '\0';
    string[-3] = '\0';
    string[-2] = '\0';
    string[-1] = '\0';
    SetLastError(dwErrCode);
  }
  pcVar2 = _i;
  string[-8] = -0x77;
  string[-7] = -0x15;
  string[-6] = '\x17';
  string[-5] = '\0';
  string[-4] = '\0';
  string[-3] = '\0';
  string[-2] = '\0';
  string[-1] = '\0';
  PAL_free(pcVar2);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    local_5c = realPath._4_4_;
    if (*(LPCSTR *)(in_FS_OFFSET + 0x28) != lpPathName_local) {
      string[-8] = -0x41;
      string[-7] = -0x15;
      string[-6] = '\x17';
      string[-5] = '\0';
      string[-4] = '\0';
      string[-3] = '\0';
      string[-2] = '\0';
      string[-1] = '\0';
      __stack_chk_fail();
    }
    return realPath._4_4_;
  }
  string[-8] = -0x66;
  string[-7] = -0x15;
  string[-6] = '\x17';
  string[-5] = '\0';
  string[-4] = '\0';
  string[-3] = '\0';
  string[-2] = '\0';
  string[-1] = '\0';
  abort();
}

Assistant:

BOOL
PALAPI
CreateDirectoryA(
         IN LPCSTR lpPathName,
         IN LPSECURITY_ATTRIBUTES lpSecurityAttributes)
{
    BOOL  bRet = FALSE;
    DWORD dwLastError = 0;
    char *realPath;
    LPSTR UnixPathName = NULL;
    int pathLength;
    int i;
    const int mode = S_IRWXU | S_IRWXG | S_IRWXO;

    PERF_ENTRY(CreateDirectoryA);
    ENTRY("CreateDirectoryA(lpPathName=%p (%s), lpSecurityAttr=%p)\n",
          lpPathName?lpPathName:"NULL",
          lpPathName?lpPathName:"NULL", lpSecurityAttributes);

    if ( lpSecurityAttributes )
    {
        ASSERT("lpSecurityAttributes is not NULL as it should be\n");
        dwLastError = ERROR_INVALID_PARAMETER;
        goto done;
    }

    // Windows returns ERROR_PATH_NOT_FOUND when called with NULL.
    // If we don't have this check, strdup(NULL) segfaults.
    if (lpPathName == NULL)
    {
        ERROR("CreateDirectoryA called with NULL pathname!\n");
        dwLastError = ERROR_PATH_NOT_FOUND;
        goto done;
    }

    UnixPathName = PAL__strdup(lpPathName);
    if (UnixPathName == NULL )
    {
        ERROR("PAL__strdup() failed\n");
        dwLastError = ERROR_NOT_ENOUGH_MEMORY;
        goto done;
    }
    FILEDosToUnixPathA( UnixPathName );
    // Remove any trailing slashes at the end because mkdir might not
    // handle them appropriately on all platforms.
    pathLength = strlen(UnixPathName);
    i = pathLength;
    while(i > 1)
    {
        if(UnixPathName[i - 1] =='/')
        {
            UnixPathName[i - 1]='\0';
            i--;
        }
        else
        {
            break;
        }
    }

    // Check the constraint for the real path length (should be < MAX_LONGPATH).

    // Get an absolute path.
    if (UnixPathName[0] == '/')
    {
        realPath = UnixPathName;
    }
    else
    {
        const char *cwd = PAL__getcwd(NULL, MAX_LONGPATH);        
        if (NULL == cwd)
        {
            WARN("Getcwd failed with errno=%d [%s]\n", errno, strerror(errno));
            dwLastError = DIRGetLastErrorFromErrno();
            goto done;
        }

        // Copy cwd, '/', path
        int iLen = strlen(cwd) + 1 + pathLength + 1;
        realPath = static_cast<char *>(alloca(iLen));
        sprintf_s(realPath, iLen, "%s/%s", cwd, UnixPathName);

        PAL_free((char *)cwd);
    }
    
    // Canonicalize the path so we can determine its length.
    FILECanonicalizePath(realPath);

    if (strlen(realPath) >= MAX_LONGPATH)
    {
        WARN("UnixPathName is larger than MAX_LONGPATH (%d)!\n", MAX_LONGPATH);
        dwLastError = ERROR_FILENAME_EXCED_RANGE;
        goto done;
    }

    if ( mkdir(realPath, mode) != 0 )
    {
        TRACE("Creation of directory [%s] was unsuccessful, errno = %d.\n",
              UnixPathName, errno);

        switch( errno )
        {
        case ENOTDIR:
            /* FALL THROUGH */
        case ENOENT:
            FILEGetProperNotFoundError( realPath, &dwLastError );
            goto done;
        case EEXIST:
            dwLastError = ERROR_ALREADY_EXISTS;
            break;
        default:
            dwLastError = ERROR_ACCESS_DENIED;
        }
    }
    else
    {
        TRACE("Creation of directory [%s] was successful.\n", UnixPathName);
        bRet = TRUE;
    }

done:
    if( dwLastError )
    {
        SetLastError( dwLastError );
    }
    PAL_free( UnixPathName );
    LOGEXIT("CreateDirectoryA returns BOOL %d\n", bRet);
    PERF_EXIT(CreateDirectoryA);
    return bRet;
}